

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

Block * __thiscall
wasm::I64ToI32Lowering::lowerAdd
          (I64ToI32Lowering *this,Block *result,TempVar *leftLow,TempVar *leftHigh,TempVar *rightLow
          ,TempVar *rightHigh)

{
  Index IVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Builder *pBVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  Binary *pBVar7;
  LocalSet *append;
  LocalSet *append_00;
  Const *pCVar8;
  LocalSet *pLVar9;
  If *this_00;
  LocalGet *args_1;
  Block *pBVar10;
  ulong uVar11;
  optional<wasm::Type> type_;
  Block *local_b0;
  undefined1 local_a8 [8];
  TempVar highResult;
  undefined1 local_70 [8];
  TempVar lowResult;
  
  highResult.ty.id = (uintptr_t)rightHigh;
  lowResult.ty.id = (uintptr_t)rightLow;
  getTemp((TempVar *)local_70,this,(Type)0x2);
  getTemp((TempVar *)local_a8,this,(Type)0x2);
  uVar3 = local_70._0_4_;
  if (((char)lowResult.pass != '\x01') && (leftLow->moved != true)) {
    pBVar4 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar1 = leftLow->idx;
    pEVar5 = (Expression *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x18,8);
    pEVar5->_id = LocalGetId;
    *(Index *)(pEVar5 + 1) = IVar1;
    (pEVar5->type).id = 2;
    if (*(char *)(lowResult.ty.id + 0x10) != '\x01') {
      uVar2 = *(undefined4 *)lowResult.ty.id;
      pEVar6 = (Expression *)
               MixedArena::allocSpace
                         (&((this->builder)._M_t.
                            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                            .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                           allocator,0x18,8);
      pEVar6->_id = LocalGetId;
      *(undefined4 *)(pEVar6 + 1) = uVar2;
      (pEVar6->type).id = 2;
      pBVar7 = (Binary *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x28,8);
      (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar7->op = AddInt32;
      pBVar7->left = pEVar5;
      pBVar7->right = pEVar6;
      Binary::finalize(pBVar7);
      append = Builder::makeLocalSet(pBVar4,uVar3,(Expression *)pBVar7);
      uVar3 = local_a8._0_4_;
      if ((char)highResult.pass != '\x01') {
        if (leftHigh->moved != true) {
          pBVar4 = (this->builder)._M_t.
                   super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                   super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
          IVar1 = leftHigh->idx;
          pEVar5 = (Expression *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x18,8);
          pEVar5->_id = LocalGetId;
          *(Index *)(pEVar5 + 1) = IVar1;
          (pEVar5->type).id = 2;
          if (*(char *)(highResult.ty.id + 0x10) != '\x01') {
            uVar2 = *(undefined4 *)highResult.ty.id;
            pEVar6 = (Expression *)
                     MixedArena::allocSpace
                               (&((this->builder)._M_t.
                                  super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                  .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm
                                 ->allocator,0x18,8);
            pEVar6->_id = LocalGetId;
            *(undefined4 *)(pEVar6 + 1) = uVar2;
            (pEVar6->type).id = 2;
            pBVar7 = (Binary *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x28,8);
            (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
                 BinaryId;
            (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id =
                 0;
            pBVar7->op = AddInt32;
            pBVar7->left = pEVar5;
            pBVar7->right = pEVar6;
            Binary::finalize(pBVar7);
            append_00 = Builder::makeLocalSet(pBVar4,uVar3,(Expression *)pBVar7);
            if ((char)highResult.pass != '\x01') {
              pBVar4 = (this->builder)._M_t.
                       super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                       super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
              pEVar5 = (Expression *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x18,8);
              pEVar5->_id = LocalGetId;
              *(undefined4 *)(pEVar5 + 1) = local_a8._0_4_;
              (pEVar5->type).id = 2;
              pCVar8 = Builder::makeConst<int>
                                 ((this->builder)._M_t.
                                  super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                  .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,1);
              pBVar7 = (Binary *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x28,8);
              (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
                   BinaryId;
              (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id
                   = 0;
              pBVar7->op = AddInt32;
              pBVar7->left = pEVar5;
              pBVar7->right = (Expression *)pCVar8;
              Binary::finalize(pBVar7);
              pLVar9 = Builder::makeLocalSet(pBVar4,local_a8._0_4_,(Expression *)pBVar7);
              uVar3 = local_70._0_4_;
              if ((char)lowResult.pass != '\x01') {
                pBVar4 = (this->builder)._M_t.
                         super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                         .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
                pEVar5 = (Expression *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x18,8);
                pEVar5->_id = LocalGetId;
                *(undefined4 *)(pEVar5 + 1) = uVar3;
                (pEVar5->type).id = 2;
                if (*(char *)(lowResult.ty.id + 0x10) != '\x01') {
                  uVar3 = *(undefined4 *)lowResult.ty.id;
                  pEVar6 = (Expression *)
                           MixedArena::allocSpace
                                     (&((this->builder)._M_t.
                                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)
                                       ->wasm->allocator,0x18,8);
                  pEVar6->_id = LocalGetId;
                  *(undefined4 *)(pEVar6 + 1) = uVar3;
                  (pEVar6->type).id = 2;
                  pBVar7 = (Binary *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x28,8);
                  (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id
                       = BinaryId;
                  (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type
                  .id = 0;
                  pBVar7->op = LtUInt32;
                  pBVar7->left = pEVar5;
                  pBVar7->right = pEVar6;
                  Binary::finalize(pBVar7);
                  uVar11 = 0x28;
                  this_00 = (If *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x28,8);
                  (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id
                       = IfId;
                  (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type
                  .id = 0;
                  this_00->condition = (Expression *)pBVar7;
                  this_00->ifTrue = (Expression *)pLVar9;
                  this_00->ifFalse = (Expression *)0x0;
                  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
                  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._M_payload =
                       (_Storage<wasm::Type,_true>)uVar11;
                  If::finalize(this_00,type_);
                  if ((char)lowResult.pass != '\x01') {
                    args_1 = (LocalGet *)
                             MixedArena::allocSpace
                                       (&((this->builder)._M_t.
                                          super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                          .super__Head_base<0UL,_wasm::Builder_*,_false>.
                                         _M_head_impl)->wasm->allocator,0x18,8);
                    (args_1->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id
                         = LocalGetId;
                    args_1->index = local_70._0_4_;
                    (args_1->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.
                    type.id = 2;
                    pBVar4 = (this->builder)._M_t.
                             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                             .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
                    pBVar10 = Builder::blockify(pBVar4,(Expression *)result,(Expression *)append);
                    pBVar10 = Builder::blockify<wasm::If*,wasm::LocalGet*>
                                        (pBVar4,(Expression *)pBVar10,(Expression *)append_00,
                                         this_00,args_1);
                    local_b0 = pBVar10;
                    std::
                    _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
                              ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                *)&this->highBitVars,&local_b0,local_a8);
                    TempVar::~TempVar((TempVar *)local_a8);
                    TempVar::~TempVar((TempVar *)local_70);
                    return pBVar10;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

Block* lowerAdd(Block* result,
                  TempVar&& leftLow,
                  TempVar&& leftHigh,
                  TempVar&& rightLow,
                  TempVar&& rightHigh) {
    TempVar lowResult = getTemp();
    TempVar highResult = getTemp();
    LocalSet* addLow = builder->makeLocalSet(
      lowResult,
      builder->makeBinary(AddInt32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32)));
    LocalSet* addHigh = builder->makeLocalSet(
      highResult,
      builder->makeBinary(AddInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(rightHigh, Type::i32)));
    LocalSet* carryBit = builder->makeLocalSet(
      highResult,
      builder->makeBinary(AddInt32,
                          builder->makeLocalGet(highResult, Type::i32),
                          builder->makeConst(int32_t(1))));
    If* checkOverflow = builder->makeIf(
      builder->makeBinary(LtUInt32,
                          builder->makeLocalGet(lowResult, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32)),
      carryBit);
    LocalGet* getLow = builder->makeLocalGet(lowResult, Type::i32);
    result = builder->blockify(result, addLow, addHigh, checkOverflow, getLow);
    setOutParam(result, std::move(highResult));
    return result;
  }